

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

void QCss::Scanner::scan(QString *preprocessedInput,QList<QCss::Symbol> *symbols)

{
  int iVar1;
  long in_FS_OFFSET;
  undefined1 *local_80;
  QString local_78;
  int local_60;
  int iStack_5c;
  undefined1 local_58 [16];
  qsizetype local_48;
  undefined1 local_40 [16];
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (undefined1  [16])0x0;
  local_48 = 0;
  QString::operator=((QString *)local_58,(QString *)preprocessedInput);
  local_40 = (undefined1  [16])0x0;
  local_30 = (undefined1 *)0x0;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr._0_4_ = 0;
  local_78.d.ptr._4_4_ = 0;
  local_78.d.size = 0;
  local_60 = 0;
  iStack_5c = -1;
  iVar1 = QCssScanner_Generated::lex((QCssScanner_Generated *)local_58);
  if (iVar1 != -1) {
    do {
      local_80 = (undefined1 *)CONCAT44(local_80._4_4_,iVar1);
      QString::operator=(&local_78,(QString *)local_58);
      local_60 = local_40._8_4_;
      iStack_5c = (int)local_30;
      QtPrivate::QMovableArrayOps<QCss::Symbol>::emplace<QCss::Symbol_const&>
                ((QMovableArrayOps<QCss::Symbol> *)symbols,(symbols->d).size,(Symbol *)&local_80);
      QList<QCss::Symbol>::end(symbols);
      iVar1 = QCssScanner_Generated::lex((QCssScanner_Generated *)local_58);
    } while (iVar1 != -1);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Scanner::scan(const QString &preprocessedInput, QList<Symbol> *symbols)
{
    QCssScanner_Generated scanner(preprocessedInput);
    Symbol sym;
    int tok = scanner.lex();
    while (tok != -1) {
        sym.token = static_cast<QCss::TokenType>(tok);
        sym.text = scanner.input;
        sym.start = scanner.lexemStart;
        sym.len = scanner.lexemLength;
        symbols->append(sym);
        tok = scanner.lex();
    }
}